

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.cpp
# Opt level: O0

void __thiscall Event::Event(Event *this,EventRegister *_register,string *name)

{
  string *name_local;
  EventRegister *_register_local;
  Event *this_local;
  
  this->m_eventRegister = _register;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  std::vector<Callable,_std::allocator<Callable>_>::vector(&this->m_listeners);
  return;
}

Assistant:

Event::Event(EventRegister *_register, std::string name)
    : m_eventRegister(_register),
      m_name{std::move(name)}
{
}